

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::PowId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,PowConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>
          *prepro)

{
  iterator u;
  iterator __last;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>
  *in_RDX;
  long in_RSI;
  double __x;
  double __x_00;
  double __y;
  double __y_00;
  array<double,_4UL> rb_1;
  array<double,_4UL> rb;
  double uby;
  double lby;
  double ubx;
  value_type y;
  double lbx;
  value_type x;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>
  *in_stack_ffffffffffffff40;
  
  CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>::GetArguments
            ((CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId> *)
             (in_RSI + 0x28));
  std::array<int,_2UL>::operator[]
            ((array<int,_2UL> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  __x = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::lb(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  if (0.0 <= __x) {
    CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>::GetArguments
              ((CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId> *)
               (in_RSI + 0x28));
    std::array<int,_2UL>::operator[]
              ((array<int,_2UL> *)in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    __x_00 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::ub(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    __y = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::lb(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    __y_00 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::ub(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    if ((1e-10 <= __x) || (1e-10 <= __y)) {
      pow(__x,__y);
      pow(__x,__y_00);
      pow(__x_00,__y);
      pow(__x_00,__y_00);
      std::array<double,_4UL>::begin((array<double,_4UL> *)0x56a87a);
      std::array<double,_4UL>::end((array<double,_4UL> *)0x56a889);
      std::min_element<double*>(&in_stack_ffffffffffffff40->lb_,in_stack_ffffffffffffff38);
      std::array<double,_4UL>::begin((array<double,_4UL> *)0x56a8aa);
      std::array<double,_4UL>::end((array<double,_4UL> *)0x56a8b9);
      std::max_element<double*>(&in_stack_ffffffffffffff40->lb_,in_stack_ffffffffffffff38);
      PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>
      ::narrow_result_bounds
                (in_stack_ffffffffffffff40,(double)in_stack_ffffffffffffff38,
                 (double)in_stack_ffffffffffffff30);
    }
    else {
      pow(1e-10,__y);
      pow(1e-10,__y_00);
      pow(__x_00,__y);
      pow(__x_00,__y_00);
      u = std::array<double,_4UL>::begin((array<double,_4UL> *)0x56a968);
      std::array<double,_4UL>::end((array<double,_4UL> *)0x56a977);
      std::min_element<double*>(&in_RDX->lb_,in_stack_ffffffffffffff38);
      __last = std::array<double,_4UL>::begin((array<double,_4UL> *)0x56a998);
      std::array<double,_4UL>::end((array<double,_4UL> *)0x56a9a7);
      std::max_element<double*>(&in_RDX->lb_,__last);
      PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>
      ::narrow_result_bounds(in_RDX,(double)__last,(double)u);
    }
  }
  return;
}

Assistant:

void PreprocessConstraint(
      PowConstraint& c, PreprocessInfo& prepro) {
    auto x = c.GetArguments()[0];
    auto lbx = MPCD( lb(x) );
    if (lbx >= 0.0) {
      auto y = c.GetArguments()[1];
      auto ubx = MPCD( ub(x) );
      auto lby = MPCD( lb(y) );
      auto uby = MPCD( ub(y) );
      if (lbx >= 1e-10 || lby >= 1e-10) {
        std::array<double, 4> rb
            {std::pow(lbx, lby), std::pow(lbx, uby),
                                 std::pow(ubx, lby), std::pow(ubx, uby)};
        prepro.narrow_result_bounds(
            *std::min_element(rb.begin(), rb.end()),
            *std::max_element(rb.begin(), rb.end()) );
      } else {
        std::array<double, 4> rb
            {std::pow(1e-10, lby), std::pow(1e-10, uby),
             std::pow(ubx, lby), std::pow(ubx, uby)};
        prepro.narrow_result_bounds(
            *std::min_element(rb.begin(), rb.end()),
            *std::max_element(rb.begin(), rb.end()) );
      }
    }
  }